

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_decompressBegin(ZSTD_DCtx *dctx)

{
  if (dctx == (ZSTD_DCtx *)0x0) {
    __assert_fail("dctx != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xa14a,"size_t ZSTD_decompressBegin(ZSTD_DCtx *)");
  }
  if (dctx->format < 2) {
    dctx->expected = (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
    dctx->previousDstEnd = (void *)0x0;
    dctx->prefixStart = (void *)0x0;
    dctx->virtualStart = (void *)0x0;
    dctx->dictEnd = (void *)0x0;
    dctx->processedCSize = 0;
    dctx->decodedSize = 0;
    (dctx->entropy).hufTable[0] = 0xc00000c;
    dctx->dictID = 0;
    dctx->bType = bt_reserved;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    dctx->litEntropy = 0;
    dctx->fseEntropy = 0;
    (dctx->entropy).rep[0] = 1;
    (dctx->entropy).rep[1] = 4;
    (dctx->entropy).rep[2] = 8;
    dctx->LLTptr = (dctx->entropy).LLTable;
    dctx->MLTptr = (dctx->entropy).MLTable;
    dctx->OFTptr = (dctx->entropy).OFTable;
    dctx->HUFptr = (dctx->entropy).hufTable;
    return 0;
  }
  __assert_fail("(format == ZSTD_f_zstd1) || (format == ZSTD_f_zstd1_magicless)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x9c36,"size_t ZSTD_startingInputLength(ZSTD_format_e)");
}

Assistant:

size_t ZSTD_decompressBegin(ZSTD_DCtx* dctx)
{
    assert(dctx != NULL);
#if ZSTD_TRACE
    dctx->traceCtx = (ZSTD_trace_decompress_begin != NULL) ? ZSTD_trace_decompress_begin(dctx) : 0;
#endif
    dctx->expected = ZSTD_startingInputLength(dctx->format);  /* dctx->format must be properly set */
    dctx->stage = ZSTDds_getFrameHeaderSize;
    dctx->processedCSize = 0;
    dctx->decodedSize = 0;
    dctx->previousDstEnd = NULL;
    dctx->prefixStart = NULL;
    dctx->virtualStart = NULL;
    dctx->dictEnd = NULL;
    dctx->entropy.hufTable[0] = (HUF_DTable)((ZSTD_HUFFDTABLE_CAPACITY_LOG)*0x1000001);  /* cover both little and big endian */
    dctx->litEntropy = dctx->fseEntropy = 0;
    dctx->dictID = 0;
    dctx->bType = bt_reserved;
    ZSTD_STATIC_ASSERT(sizeof(dctx->entropy.rep) == sizeof(repStartValue));
    ZSTD_memcpy(dctx->entropy.rep, repStartValue, sizeof(repStartValue));  /* initial repcodes */
    dctx->LLTptr = dctx->entropy.LLTable;
    dctx->MLTptr = dctx->entropy.MLTable;
    dctx->OFTptr = dctx->entropy.OFTable;
    dctx->HUFptr = dctx->entropy.hufTable;
    return 0;
}